

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::local_m_map_t::clear(local_m_map_t *this)

{
  reference ppmVar1;
  uint local_14;
  loc_id_t id;
  local_m_map_t *this_local;
  
  for (local_14 = 0; local_14 < this->_loc_nb; local_14 = local_14 + 1) {
    ppmVar1 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_M,(ulong)local_14);
    deallocate_map(*ppmVar1);
  }
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::clear(&this->_M);
  this->_loc_nb = 0;
  this->_clock_nb = 0;
  return;
}

Assistant:

void local_m_map_t::clear()
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
    tchecker::clockbounds::deallocate_map(_M[id]);
  _M.clear();
  _loc_nb = 0;
  _clock_nb = 0;
}